

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O3

void float_up(void)

{
  boolean bVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (u.utrap == 0) {
    bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level);
    if (bVar1 == '\0') {
      if ((u._1052_1_ & 2) != 0) {
        spoteffects('\x01');
        goto LAB_0026a47b;
      }
      if ((u._1052_1_ & 1) != 0) {
        pcVar3 = "You float away from the %s.";
        if (((u.ustuck)->data->mflags1 & 0x40000) == 0) {
          pcVar3 = "You spiral up into %s.";
          pcVar2 = mon_nam(u.ustuck);
        }
        else {
          pcVar2 = surface((int)u.ux,(int)u.uy);
        }
        goto LAB_0026a471;
      }
      if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
         ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))) {
        bVar1 = on_level(&u.uz,&dungeon_topology.d_air_level);
        if (bVar1 == '\0') {
          pcVar3 = "You start to float in the air!";
        }
        else {
          pcVar3 = "You gain control over your movements.";
        }
      }
      else {
        pcVar3 = "Up, up, and awaaaay!  You\'re walking on air!";
      }
    }
    else {
      pcVar3 = "It feels as though you\'ve lost some weight.";
    }
LAB_0026a457:
    pline(pcVar3);
  }
  else {
    if (u.utraptype == 5) {
      u.utrap = 0;
      u.utraptype = 0;
      pcVar3 = "You float up, out of the swamp.";
      goto LAB_0026a457;
    }
    if (u.utraptype == 4) {
      pcVar3 = body_part(9);
      pcVar2 = makeplural(pcVar3);
      pcVar3 = "Your body pulls upward, but your %s are still stuck.";
    }
    else {
      if (u.utraptype == 1) {
        u.utrap = 0;
        u.utraptype = 1;
        pline("You float up, out of the pit!");
        vision_full_recalc = '\x01';
        fill_pit(level,(int)u.ux,(int)u.uy);
        goto LAB_0026a47b;
      }
      pcVar2 = body_part(9);
      pcVar3 = "You float up, only your %s is still stuck.";
    }
LAB_0026a471:
    pline(pcVar3,pcVar2);
  }
LAB_0026a47b:
  if (((u.usteed == (monst *)0x0) || ((u.usteed)->data->mlet == '\x05')) ||
     (((u.usteed)->data->mflags1 & 1) != 0)) {
    return;
  }
  if ((u.uprops[0x12].intrinsic >> 0x1c & 1) == 0) {
    if (((u.uprops[0x12].intrinsic & 0xef000000) == 0 & (byte)(u.uprops[0x12].extrinsic >> 0xd) & 1)
        == 0) goto LAB_0026a579;
  }
  else if ((u.uprops[0x12].intrinsic & 0xef000000) != 0) goto LAB_0026a579;
  if (((u.uprops[0x12].extrinsic & 0xffffdfff) == 0) && ((youmonst.data)->mlet != '\x05')) {
    pcVar3 = Monnam(u.usteed);
    pline("%s magically floats up!",pcVar3);
    return;
  }
LAB_0026a579:
  pcVar3 = mon_nam(u.usteed);
  pline("You cannot stay on %s.",pcVar3);
  dismount_steed(0);
  return;
}

Assistant:

void float_up(void)
{
	if (u.utrap) {
		if (u.utraptype == TT_PIT) {
			u.utrap = 0;
			pline("You float up, out of the pit!");
			vision_full_recalc = 1;	/* vision limits change */
			fill_pit(level, u.ux, u.uy);
		} else if (u.utraptype == TT_INFLOOR) {
			pline("Your body pulls upward, but your %s are still stuck.",
			     makeplural(body_part(LEG)));
		} else if (u.utraptype == TT_SWAMP) {
			u.utrap = 0;
			u.utraptype = 0;
			pline("You float up, out of the swamp.");
		} else {
			pline("You float up, only your %s is still stuck.",
				body_part(LEG));
		}
	}
	else if (Is_waterlevel(&u.uz))
		pline("It feels as though you've lost some weight.");
	else if (u.uinwater)
		spoteffects(TRUE);
	else if (u.uswallow)
		pline(is_animal(u.ustuck->data) ?
			"You float away from the %s."  :
			"You spiral up into %s.",
		    is_animal(u.ustuck->data) ?
			surface(u.ux, u.uy) :
			mon_nam(u.ustuck));
	else if (Hallucination)
		pline("Up, up, and awaaaay!  You're walking on air!");
	else if (Is_airlevel(&u.uz))
		pline("You gain control over your movements.");
	else
		pline("You start to float in the air!");
	if (u.usteed && !is_floater(u.usteed->data) &&
						!is_flyer(u.usteed->data)) {
	    if (Lev_at_will)
	    	pline("%s magically floats up!", Monnam(u.usteed));
	    else {
	    	pline("You cannot stay on %s.", mon_nam(u.usteed));
	    	dismount_steed(DISMOUNT_GENERIC);
	    }
	}
	return;
}